

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O0

int Abc_TtFindFirstBit2(word *pIn,int nWords)

{
  int iVar1;
  int local_20;
  int w;
  int nWords_local;
  word *pIn_local;
  
  local_20 = 0;
  while( true ) {
    if (nWords <= local_20) {
      return -1;
    }
    if (pIn[local_20] != 0) break;
    local_20 = local_20 + 1;
  }
  iVar1 = Abc_Tt6FirstBit(pIn[local_20]);
  return local_20 * 0x40 + iVar1;
}

Assistant:

static inline int Abc_TtFindFirstBit2( word * pIn, int nWords )
{
    int w;
    for ( w = 0; w < nWords; w++ )
        if ( pIn[w] )
            return 64*w + Abc_Tt6FirstBit(pIn[w]);
    return -1;
}